

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeString::setToBogus(UnicodeString *this)

{
  char16_t *pcVar1;
  
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x4) !=
      (undefined1  [56])0x0) {
    LOCK();
    pcVar1 = (this->fUnion).fFields.fArray + -2;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    UNLOCK();
    if (*(int *)pcVar1 == 0) {
      uprv_free_63((this->fUnion).fFields.fArray + -2);
    }
  }
  (this->fUnion).fStackFields.fLengthAndFlags = 1;
  (this->fUnion).fFields.fArray = (char16_t *)0x0;
  (this->fUnion).fFields.fCapacity = 0;
  return;
}

Assistant:

void
UnicodeString::setToBogus()
{
  releaseArray();

  fUnion.fFields.fLengthAndFlags = kIsBogus;
  fUnion.fFields.fArray = 0;
  fUnion.fFields.fCapacity = 0;
}